

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

bool jsoncons::detail::dtoa_general<std::__cxx11::string>
               (double param_1,char param_2,undefined8 param_3)

{
  bool bVar1;
  char cVar2;
  double u;
  char buffer [100];
  int *in_stack_00000088;
  int k;
  int length;
  char *result;
  double in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  bool local_1;
  
  cVar2 = (char)param_3;
  if ((param_1 != 0.0) || (NAN(param_1))) {
    std::signbit(param_1);
    bVar1 = grisu3(in_stack_000000a0,result,_k,in_stack_00000088);
    if (bVar1) {
      bVar1 = std::signbit(param_1);
      if (bVar1) {
        std::__cxx11::string::push_back(cVar2);
      }
      prettify_string<std::__cxx11::string>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      local_1 = true;
    }
    else {
      local_1 = dtoa_general<std::__cxx11::string>(param_1,(int)param_2,param_3);
    }
  }
  else {
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dtoa_general(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            // min exp: -4 is consistent with sprintf
            // max exp: std::numeric_limits<double>::max_digits10
            jsoncons::detail::prettify_string(buffer, length, k, -4, std::numeric_limits<double>::max_digits10, result);
            return true;
        }
        else
        {
            return dtoa_general(v, decimal_point, result, std::false_type());
        }
    }